

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::PropagateOnAll_InsertDecomposes_Test::TestBody
          (PropagateOnAll_InsertDecomposes_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer prVar3;
  char *in_R9;
  AssertHelper local_1d8;
  Message local_1d0;
  size_t local_1c8;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  Message local_1a0;
  size_t local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  size_t local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>::iterator,_bool>
  local_110;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  size_t local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  size_t local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_68;
  size_t local_60;
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>::iterator,_bool>
  local_38;
  undefined1 local_20 [8];
  iterator it;
  PropagateOnAll_InsertDecomposes_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)this;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
  ::insert<int,_0,_0,_nullptr>
            (&local_38,&(this->super_PropagateOnAll).t1,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_20 = (undefined1  [8])local_38.first.ctrl_;
  it.ctrl_ = (ctrl_t *)local_38.first.field_1.slot_;
  local_54 = 1;
  local_60 = CheckedAlloc<phmap::priv::Tracked<int>,_7>::num_allocs
                       (&(this->super_PropagateOnAll).a1);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_50,"1","a1.num_allocs()",&local_54,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_94 = 0;
  prVar3 = raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
           ::iterator::operator->((iterator *)local_20);
  local_a0 = Tracked<int>::num_moves(prVar3);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_90,"0","it->num_moves()",&local_94,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c4 = 0;
  prVar3 = raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
           ::iterator::operator->((iterator *)local_20);
  local_d0 = Tracked<int>::num_copies(prVar3);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c0,"0","it->num_copies()",&local_c4,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_114 = 0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
  ::insert<int,_0,_0,_nullptr>(&local_110,&(this->super_PropagateOnAll).t1,&local_114);
  local_f1 = (bool)((local_110.second ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_f0,
               (AssertionResult *)"t1.insert(0).second","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_15c = 1;
  local_168 = CheckedAlloc<phmap::priv::Tracked<int>,_7>::num_allocs
                        (&(this->super_PropagateOnAll).a1);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_158,"1","a1.num_allocs()",&local_15c,&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_18c = 0;
  prVar3 = raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
           ::iterator::operator->((iterator *)local_20);
  local_198 = Tracked<int>::num_moves(prVar3);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_188,"0","it->num_moves()",&local_18c,&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1bc = 0;
  prVar3 = raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
           ::iterator::operator->((iterator *)local_20);
  local_1c8 = Tracked<int>::num_copies(prVar3);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b8,"0","it->num_copies()",&local_1bc,&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  return;
}

Assistant:

TEST_F(PropagateOnAll, InsertDecomposes) {
  auto it = t1.insert(0).first;
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(0, it->num_copies());

  EXPECT_FALSE(t1.insert(0).second);
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(0, it->num_copies());
}